

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

wchar_t rar5_bid(archive_read *a,wchar_t best_bid)

{
  long *plVar1;
  int *piVar2;
  void *pvVar3;
  wchar_t wVar4;
  size_t min;
  long *plVar5;
  long lVar6;
  ulong uVar7;
  char signature [8];
  ssize_t avail;
  ssize_t local_38;
  ssize_t local_30;
  
  wVar4 = L'\xffffffff';
  if (best_bid < L'\x1f') {
    local_38 = 0x1071a21726152;
    local_30 = -1;
    plVar1 = (long *)__archive_read_ahead(a,8,&local_30);
    if ((plVar1 == (long *)0x0) || (local_38 != *plVar1)) {
      piVar2 = (int *)__archive_read_ahead(a,7,(ssize_t *)0x0);
      if ((piVar2 != (int *)0x0) &&
         ((((char)*piVar2 == 'M' && (*(char *)((long)piVar2 + 1) == 'Z')) ||
          (wVar4 = L'\0', *piVar2 == 0x464c457f)))) {
        local_30 = 0x1071a21726152;
        lVar6 = 0x10000;
        uVar7 = 0x1000;
        min = 0x11000;
        do {
          pvVar3 = __archive_read_ahead(a,min,&local_38);
          if (pvVar3 == (void *)0x0) {
            uVar7 = (long)uVar7 >> 1;
            if (uVar7 < 0x40) break;
          }
          else {
            plVar5 = (long *)((long)pvVar3 + lVar6 + 8);
            plVar1 = (long *)((long)pvVar3 + lVar6);
            while (plVar5 < (long *)(local_38 + (long)pvVar3)) {
              if (*plVar1 == local_30) goto LAB_00158657;
              plVar5 = plVar1 + 3;
              plVar1 = plVar1 + 2;
            }
            lVar6 = (long)plVar1 - (long)pvVar3;
          }
          min = uVar7 + lVar6;
        } while ((long)min < 0x80001);
        wVar4 = L'\0';
      }
    }
    else {
LAB_00158657:
      wVar4 = L'\x1e';
    }
  }
  return wVar4;
}

Assistant:

static int rar5_bid(struct archive_read* a, int best_bid) {
	int my_bid;

	if(best_bid > 30)
		return -1;

	my_bid = bid_standard(a);
	if(my_bid > -1) {
		return my_bid;
	}
	my_bid = bid_sfx(a);
	if (my_bid > -1) {
		return my_bid;
	}

	return -1;
}